

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::mergeBlockDefinitions(TInfoSink&,glslang::TIntermSymbol*,glslang::
TIntermSymbol*,glslang::TIntermediate*)::TMergeBlockTraverser::visitBinary(glslang::TVisit,glslang::
TIntermBinary__(void *this,TVisit param_1,TIntermBinary *node)

{
  uint u;
  TIntermediate *this_00;
  bool bVar1;
  TOperator TVar2;
  int iVar3;
  undefined4 extraout_var;
  TType *this_01;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  TConstUnionArray *this_02;
  TConstUnion *this_03;
  mapped_type_conflict *pmVar5;
  undefined4 extraout_var_02;
  TSourceLoc *loc;
  TIntermConstantUnion *pTVar6;
  TIntermTyped *newConstNode;
  uint newIdx;
  uint memberIdx;
  TIntermConstantUnion *constNode;
  TIntermBinary *node_local;
  void *pvStack_18;
  TVisit param_1_local;
  TMergeBlockTraverser *this_local;
  
  if ((((*(long *)((long)this + 0x48) != 0) && (*(long *)((long)this + 0x40) != 0)) &&
      (*(long *)((long)this + 0x50) != 0)) &&
     ((constNode = (TIntermConstantUnion *)node, node_local._4_4_ = param_1, pvStack_18 = this,
      bVar1 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::empty(*(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        **)((long)this + 0x50)), !bVar1 &&
      (TVar2 = TIntermOperator::getOp((TIntermOperator *)constNode), TVar2 == EOpIndexDirectStruct))
     )) {
    iVar3 = (*(constNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    this_01 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xf0))();
    bVar1 = TType::operator==(this_01,*(TType **)((long)this + 0x40));
    if (bVar1) {
      iVar3 = (*(constNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x28))();
      if (lVar4 == 0) {
        __assert_fail("node->getRight()->getAsConstantUnion()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x314,
                      "virtual bool glslang::TIntermediate::mergeBlockDefinitions(TInfoSink &, TIntermSymbol *, TIntermSymbol *, TIntermediate *)::TMergeBlockTraverser::visitBinary(TVisit, glslang::TIntermBinary *)"
                     );
      }
      iVar3 = (*(constNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
      _newIdx = (TIntermConstantUnion *)
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x28))();
      this_02 = TIntermConstantUnion::getConstArray(_newIdx);
      this_03 = TConstUnionArray::operator[](this_02,0);
      newConstNode._4_4_ = TConstUnion::getUConst(this_03);
      pmVar5 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::at(*(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      **)((long)this + 0x50),(key_type_conflict *)((long)&newConstNode + 4));
      u = *pmVar5;
      this_00 = *(TIntermediate **)((long)this + 0x48);
      newConstNode._0_4_ = u;
      iVar3 = (*(constNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
      loc = (TSourceLoc *)(*(code *)**(undefined8 **)CONCAT44(extraout_var_02,iVar3))();
      pTVar6 = addConstantUnion(this_00,u,loc,false);
      (*(constNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x31])(constNode,pTVar6)
      ;
      if (_newIdx != (TIntermConstantUnion *)0x0) {
        (*(_newIdx->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1c])();
      }
    }
  }
  return true;
}

Assistant:

virtual bool visitBinary(TVisit, glslang::TIntermBinary* node)
        {
            if (!unit || !newType || !memberIndexUpdates || memberIndexUpdates->empty())
                return true;

            if (node->getOp() == EOpIndexDirectStruct && node->getLeft()->getType() == *newType) {
                // this is a dereference to a member of the block since the
                // member list changed, need to update this to point to the
                // right index
                assert(node->getRight()->getAsConstantUnion());

                glslang::TIntermConstantUnion* constNode = node->getRight()->getAsConstantUnion();
                unsigned int memberIdx = constNode->getConstArray()[0].getUConst();
                unsigned int newIdx = memberIndexUpdates->at(memberIdx);
                TIntermTyped* newConstNode = unit->addConstantUnion(newIdx, node->getRight()->getLoc());

                node->setRight(newConstNode);
                delete constNode;

                return true;
            }
            return true;
        }